

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stbi.h
# Opt level: O1

int stbi__hdr_test_core(stbi__context *s,char *signature)

{
  stbi_uc *psVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  byte *pbVar5;
  char *pcVar6;
  
  if (*signature != '\0') {
    psVar1 = s->buffer_start;
    pcVar6 = signature + 1;
    do {
      pbVar5 = s->img_buffer;
      if (pbVar5 < s->img_buffer_end) {
LAB_0011cebf:
        s->img_buffer = pbVar5 + 1;
        uVar4 = (uint)*pbVar5;
      }
      else {
        if (s->read_from_callbacks != 0) {
          iVar3 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
          if (iVar3 == 0) {
            s->read_from_callbacks = 0;
            s->img_buffer = psVar1;
            s->img_buffer_end = s->buffer_start + 1;
            s->buffer_start[0] = '\0';
          }
          else {
            s->img_buffer = psVar1;
            s->img_buffer_end = psVar1 + iVar3;
          }
          pbVar5 = s->img_buffer;
          goto LAB_0011cebf;
        }
        uVar4 = 0;
      }
      if (uVar4 != (int)pcVar6[-1]) {
        return 0;
      }
      cVar2 = *pcVar6;
      pcVar6 = pcVar6 + 1;
    } while (cVar2 != '\0');
  }
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  return 1;
}

Assistant:

static int stbi__hdr_test_core(stbi__context *s, const char *signature)
{
   int i;
   for (i=0; signature[i]; ++i)
      if (stbi__get8(s) != signature[i])
          return 0;
   stbi__rewind(s);
   return 1;
}